

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O0

int get_lower_levels_ctx_general
              (int is_last,int scan_idx,int bhl,int width,uint8_t *levels,int coeff_idx,
              TX_SIZE tx_size,TX_CLASS tx_class)

{
  int iVar1;
  byte bVar2;
  int in_ECX;
  int in_EDX;
  long lVar3;
  int in_ESI;
  int in_EDI;
  long in_R8;
  int in_R9D;
  byte in_stack_00000008;
  char in_stack_00000010;
  int stats;
  int mag;
  int row;
  int col_1;
  int col;
  int ctx;
  uint local_8c;
  int local_5c;
  int local_3c;
  int local_4;
  
  bVar2 = (byte)in_EDX;
  if (in_EDI == 0) {
    iVar1 = get_padded_idx(in_R9D,in_EDX);
    lVar3 = in_R8 + iVar1;
    iVar1 = (uint)""[*(byte *)(lVar3 + 1)] +
            (uint)""[*(byte *)(lVar3 + ((1 << (bVar2 & 0x1f)) + 4))];
    if (in_stack_00000010 == '\0') {
      local_3c = (uint)""[*(byte *)(lVar3 + 2)] +
                 (uint)""[*(byte *)(lVar3 + ((2 << (bVar2 & 0x1f)) + 8))] +
                 (uint)""[*(byte *)(lVar3 + ((1 << (bVar2 & 0x1f)) + 5))] + iVar1;
    }
    else if (in_stack_00000010 == '\x02') {
      local_3c = (uint)""[*(byte *)(lVar3 + 4)] +
                 (uint)""[*(byte *)(lVar3 + 3)] + (uint)""[*(byte *)(lVar3 + 2)] + iVar1;
    }
    else {
      local_3c = (uint)""[*(byte *)(lVar3 + ((4 << (bVar2 & 0x1f)) + 0x10))] +
                 (uint)""[*(byte *)(lVar3 + ((3 << (bVar2 & 0x1f)) + 0xc))] +
                 (uint)""[*(byte *)(lVar3 + ((2 << (bVar2 & 0x1f)) + 8))] + iVar1;
    }
    if (in_stack_00000010 == '\0' && in_R9D == 0) {
      local_4 = 0;
    }
    else {
      local_8c = local_3c + 1 >> 1;
      if (3 < local_8c) {
        local_8c = 4;
      }
      if (in_stack_00000010 == '\0') {
        local_4 = local_8c + (int)av1_nz_map_ctx_offset[in_stack_00000008][in_R9D];
      }
      else if (in_stack_00000010 == '\x01') {
        local_4 = local_8c + nz_map_ctx_offset_1d[in_R9D >> (bVar2 & 0x1f)];
      }
      else if (in_stack_00000010 == '\x02') {
        local_4 = local_8c +
                  nz_map_ctx_offset_1d[in_R9D - ((in_R9D >> (bVar2 & 0x1f)) << (bVar2 & 0x1f))];
      }
      else {
        local_4 = 0;
      }
    }
    local_5c = local_4;
  }
  else if (in_ESI == 0) {
    local_5c = 0;
  }
  else if ((in_ECX << (bVar2 & 0x1f)) >> 3 < in_ESI) {
    if ((in_ECX << (bVar2 & 0x1f)) >> 2 < in_ESI) {
      local_5c = 3;
    }
    else {
      local_5c = 2;
    }
  }
  else {
    local_5c = 1;
  }
  return local_5c;
}

Assistant:

static inline int get_lower_levels_ctx_general(int is_last, int scan_idx,
                                               int bhl, int width,
                                               const uint8_t *levels,
                                               int coeff_idx, TX_SIZE tx_size,
                                               TX_CLASS tx_class) {
  if (is_last) {
    if (scan_idx == 0) return 0;
    if (scan_idx <= (width << bhl) >> 3) return 1;
    if (scan_idx <= (width << bhl) >> 2) return 2;
    return 3;
  }
  return get_lower_levels_ctx(levels, coeff_idx, bhl, tx_size, tx_class);
}